

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

Iterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::Iterator::operator++
          (Iterator *this,int param_2)

{
  Iterator *in_RSI;
  Iterator *in_RDI;
  
  if (in_RSI->m_index < 0) {
    memcpy(in_RDI,in_RSI,0x28);
  }
  else {
    memcpy(in_RDI,in_RSI,0x28);
    operator++(in_RSI);
  }
  return in_RDI;
}

Assistant:

typename SparseMatrix<ordering>::Iterator SparseMatrix<ordering>::Iterator::operator++(int)
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        Iterator newIterator(*this);
        ++newIterator;
        return newIterator;
    }